

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWriteFileCommand.cxx
# Opt level: O0

bool __thiscall
cmWriteFileCommand::InitialPass
          (cmWriteFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  size_type sVar4;
  reference pbVar5;
  char *pcVar6;
  ostream *this_01;
  _Ios_Openmode _Var7;
  allocator local_351;
  undefined1 local_350 [8];
  string error;
  ofstream file;
  undefined1 local_128 [4];
  mode_t mode;
  string dir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string e;
  undefined1 local_a8 [7];
  bool overwrite;
  string fileName;
  const_iterator i;
  string message;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmWriteFileCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)&i);
    fileName.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&fileName.field_2 + 8));
    std::__cxx11::string::string((string *)local_a8,(string *)pbVar5);
    bVar1 = true;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&fileName.field_2 + 8),0);
    while( true ) {
      e.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)param_2_local);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&fileName.field_2 + 8),
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&e.field_2 + 8));
      if (!bVar2) break;
      pbVar5 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&fileName.field_2 + 8));
      bVar2 = std::operator==(pbVar5,"APPEND");
      if (bVar2) {
        bVar1 = false;
      }
      else {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)((long)&fileName.field_2 + 8));
        std::__cxx11::string::operator+=((string *)&i,(string *)pbVar5);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&fileName.field_2 + 8));
    }
    this_00 = (this->super_cmCommand).Makefile;
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmMakefile::CanIWriteThisFile(this_00,pcVar6);
    if (bVar2) {
      cmsys::SystemTools::GetFilenamePath((string *)local_128,(string *)local_a8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::MakeDirectory(pcVar6);
      file._508_4_ = 0;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmsys::SystemTools::GetPermissions(pcVar6,(mode_t *)&file.field_0x1fc);
      if (bVar2) {
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmsys::SystemTools::SetPermissions(pcVar6,file._508_4_ | 0x90,false);
      }
      pcVar6 = (char *)std::__cxx11::string::c_str();
      _Var7 = _S_app;
      if (bVar1) {
        _Var7 = _S_out;
      }
      std::ofstream::ofstream((void *)((long)&error.field_2 + 8),pcVar6,_Var7);
      bVar3 = std::ios::operator!((ios *)((long)&error.field_2 +
                                         *(long *)(error.field_2._8_8_ + -0x18) + 8));
      if ((bVar3 & 1) == 0) {
        this_01 = std::operator<<((ostream *)((long)&error.field_2 + 8),(string *)&i);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        std::ofstream::close();
        if (file._508_4_ != 0) {
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmsys::SystemTools::SetPermissions(pcVar6,file._508_4_,false);
        }
        this_local._7_1_ = 1;
        dir.field_2._12_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_350,"Internal CMake error when trying to open file: ",&local_351)
        ;
        std::allocator<char>::~allocator((allocator<char> *)&local_351);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator+=((string *)local_350,pcVar6);
        std::__cxx11::string::operator+=((string *)local_350," for writing.");
        cmCommand::SetError(&this->super_cmCommand,(string *)local_350);
        this_local._7_1_ = 0;
        dir.field_2._12_4_ = 1;
        std::__cxx11::string::~string((string *)local_350);
      }
      std::ofstream::~ofstream((void *)((long)&error.field_2 + 8));
      std::__cxx11::string::~string((string *)local_128);
    }
    else {
      std::operator+(&local_100,"attempted to write a file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_100," into a source directory.");
      std::__cxx11::string::~string((string *)&local_100);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_e0);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = 0;
      dir.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_e0);
    }
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&i);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmWriteFileCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::string message;
  std::vector<std::string>::const_iterator i = args.begin();

  std::string fileName = *i;
  bool overwrite = true;
  i++;

  for(;i != args.end(); ++i)
    {
    if ( *i == "APPEND" )
      {
      overwrite = false;
      }
    else
      {
      message += *i;
      }
    }

  if ( !this->Makefile->CanIWriteThisFile(fileName.c_str()) )
    {
    std::string e = "attempted to write a file: " + fileName
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  std::string dir = cmSystemTools::GetFilenamePath(fileName);
  cmSystemTools::MakeDirectory(dir.c_str());

  mode_t mode = 0;

  // Set permissions to writable
  if ( cmSystemTools::GetPermissions(fileName.c_str(), mode) )
    {
    cmSystemTools::SetPermissions(fileName.c_str(),
#if defined( _MSC_VER ) || defined( __MINGW32__ )
      mode | S_IWRITE
#else
      mode | S_IWUSR | S_IWGRP
#endif
    );
    }
  // If GetPermissions fails, pretend like it is ok. File open will fail if
  // the file is not writable
  cmsys::ofstream file(fileName.c_str(),
                     overwrite?std::ios::out : std::ios::app);
  if ( !file )
    {
    std::string error = "Internal CMake error when trying to open file: ";
    error += fileName.c_str();
    error += " for writing.";
    this->SetError(error);
    return false;
    }
  file << message << std::endl;
  file.close();
  if(mode)
    {
    cmSystemTools::SetPermissions(fileName.c_str(), mode);
    }

  return true;
}